

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRewrite.c
# Opt level: O0

void Abc_RwrExpWithCut(Abc_Obj_t *pNode,Vec_Ptr_t *vLeaves)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  uint local_2c;
  uint local_28;
  int CountB;
  int CountA;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vLeaves_local;
  Abc_Obj_t *pNode_local;
  
  pAVar2 = Abc_ObjFanin0(pNode);
  Abc_RwrExpWithCut_rec(pAVar2,vLeaves,1);
  pAVar2 = Abc_ObjFanin1(pNode);
  Abc_RwrExpWithCut_rec(pAVar2,vLeaves,0);
  local_2c = 0;
  local_28 = 0;
  for (CountB = 0; iVar1 = Vec_PtrSize(vLeaves), CountB < iVar1; CountB = CountB + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(vLeaves,CountB);
    pAVar3 = Abc_ObjRegular(pAVar2);
    local_28 = (*(uint *)&pAVar3->field_0x14 >> 4 & 1) + local_28;
    pAVar3 = Abc_ObjRegular(pAVar2);
    local_2c = (*(uint *)&pAVar3->field_0x14 >> 5 & 1) + local_2c;
    pAVar3 = Abc_ObjRegular(pAVar2);
    *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xffffffef;
    pAVar2 = Abc_ObjRegular(pAVar2);
    *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xffffffdf;
  }
  iVar1 = Vec_PtrSize(vLeaves);
  printf("(%d,%d:%d) ",(ulong)local_28,(ulong)local_2c,(ulong)((local_28 + local_2c) - iVar1));
  return;
}

Assistant:

void Abc_RwrExpWithCut( Abc_Obj_t * pNode, Vec_Ptr_t * vLeaves )
{
    Abc_Obj_t * pObj;
    int i, CountA, CountB;
    Abc_RwrExpWithCut_rec( Abc_ObjFanin0(pNode), vLeaves, 1 );
    Abc_RwrExpWithCut_rec( Abc_ObjFanin1(pNode), vLeaves, 0 );
    CountA = CountB = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
    {
        CountA += Abc_ObjRegular(pObj)->fMarkA;
        CountB += Abc_ObjRegular(pObj)->fMarkB;
        Abc_ObjRegular(pObj)->fMarkA = 0;
        Abc_ObjRegular(pObj)->fMarkB = 0;
    }
    printf( "(%d,%d:%d) ", CountA, CountB, CountA+CountB-Vec_PtrSize(vLeaves) );
}